

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

FilePath *
testing::internal::FilePath::GenerateUniqueFileName
          (FilePath *directory,FilePath *base_name,char *extension)

{
  FilePath *in_RDI;
  FilePath *in_stack_00000010;
  int number;
  FilePath *full_pathname;
  char *in_stack_000000e0;
  int in_stack_000000ec;
  FilePath *in_stack_000000f0;
  FilePath *in_stack_000000f8;
  FilePath *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  FilePath *in_stack_ffffffffffffffb0;
  
  FilePath(in_stack_ffffffffffffffb0);
  do {
    MakeFileName(in_stack_000000f8,in_stack_000000f0,in_stack_000000ec,in_stack_000000e0);
    Set((FilePath *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
        in_stack_ffffffffffffff88);
    ~FilePath((FilePath *)0x957be9);
    in_stack_ffffffffffffff97 = FileOrDirectoryExists(in_stack_00000010);
  } while ((bool)in_stack_ffffffffffffff97);
  return in_RDI;
}

Assistant:

FilePath FilePath::GenerateUniqueFileName(const FilePath& directory,
                                          const FilePath& base_name,
                                          const char* extension) {
  FilePath full_pathname;
  int number = 0;
  do {
    full_pathname.Set(MakeFileName(directory, base_name, number++, extension));
  } while (full_pathname.FileOrDirectoryExists());
  return full_pathname;
}